

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint llvm::dwarf::AttributeVersion(Attribute Attribute)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((ushort)(Attribute - DW_AT_sibling) < 0x8c) {
    uVar1 = *(uint *)(&DAT_00e75230 + (ulong)(ushort)(Attribute - DW_AT_sibling) * 4);
  }
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::AttributeVersion(dwarf::Attribute Attribute) {
  switch (Attribute) {
  default:
    return 0;
#define HANDLE_DW_AT(ID, NAME, VERSION, VENDOR)                                \
  case DW_AT_##NAME:                                                           \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}